

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_raw_key_agreement
          (psa_algorithm_t alg,psa_key_handle_t private_key,uint8_t *peer_key,size_t peer_key_length
          ,uint8_t *output,size_t output_size,size_t *output_length)

{
  int local_3c;
  psa_key_slot_t *ppStack_38;
  psa_status_t status;
  psa_key_slot_t *slot;
  size_t output_size_local;
  uint8_t *output_local;
  size_t peer_key_length_local;
  uint8_t *peer_key_local;
  psa_key_handle_t private_key_local;
  psa_algorithm_t alg_local;
  
  slot = (psa_key_slot_t *)output_size;
  output_size_local = (size_t)output;
  output_local = (uint8_t *)peer_key_length;
  peer_key_length_local = (size_t)peer_key;
  peer_key_local._2_2_ = private_key;
  peer_key_local._4_4_ = alg;
  if ((alg & 0x7f000000) == 0x30000000) {
    local_3c = psa_get_key_from_slot(private_key,&stack0xffffffffffffffc8,0x1000,alg);
    if (local_3c == 0) {
      local_3c = psa_key_agreement_raw_internal
                           (peer_key_local._4_4_,ppStack_38,(uint8_t *)peer_key_length_local,
                            (size_t)output_local,(uint8_t *)output_size_local,(size_t)slot,
                            output_length);
    }
  }
  else {
    local_3c = -0x87;
  }
  if (local_3c != 0) {
    psa_generate_random((uint8_t *)output_size_local,(size_t)slot);
    *output_length = (size_t)slot;
  }
  return local_3c;
}

Assistant:

psa_status_t psa_raw_key_agreement( psa_algorithm_t alg,
                                    psa_key_handle_t private_key,
                                    const uint8_t *peer_key,
                                    size_t peer_key_length,
                                    uint8_t *output,
                                    size_t output_size,
                                    size_t *output_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    if( ! PSA_ALG_IS_KEY_AGREEMENT( alg ) )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto exit;
    }
    status = psa_get_transparent_key( private_key, &slot,
                                      PSA_KEY_USAGE_DERIVE, alg );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_key_agreement_raw_internal( alg, slot,
                                             peer_key, peer_key_length,
                                             output, output_size,
                                             output_length );

exit:
    if( status != PSA_SUCCESS )
    {
        /* If an error happens and is not handled properly, the output
         * may be used as a key to protect sensitive data. Arrange for such
         * a key to be random, which is likely to result in decryption or
         * verification errors. This is better than filling the buffer with
         * some constant data such as zeros, which would result in the data
         * being protected with a reproducible, easily knowable key.
         */
        psa_generate_random( output, output_size );
        *output_length = output_size;
    }
    return( status );
}